

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O2

void slang::ast::ContinuousAssignSymbol::fromSyntax
               (Compilation *compilation,ContinuousAssignSyntax *syntax,ASTContext *parentContext,
               SmallVectorBase<const_slang::ast::Symbol_*> *results,
               SmallVectorBase<const_slang::ast::Symbol_*> *implicitNets)

{
  pointer ppIVar1;
  char *pcVar2;
  size_t sVar3;
  IdentifierNameSyntax *syntax_00;
  int iVar4;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_01;
  bool bVar5;
  byte bVar6;
  uint uVar7;
  NetType *netType;
  ExpressionSyntax *args;
  uint64_t hash;
  ContinuousAssignSymbol *this;
  ulong uVar8;
  pointer ppIVar9;
  ASTContext *context_00;
  long lVar10;
  ulong uVar11;
  ulong pos0;
  long lVar12;
  undefined1 auVar13 [16];
  char cVar14;
  char cVar15;
  char cVar16;
  byte bVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  byte bVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  byte bVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  byte bVar29;
  undefined1 local_210 [16];
  const_iterator __begin2;
  SmallVector<const_slang::syntax::IdentifierNameSyntax_*,_5UL> implicitNetNames;
  ASTContext local_160;
  SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  seenNames;
  ASTContext context;
  
  ASTContext::resetFlags(&context,parentContext,(bitmask<slang::ast::ASTFlags>)0x20);
  netType = Scope::getDefaultNetType(context.scope.ptr);
  SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  ::SmallSet(&seenNames);
  __begin2.index = 0;
  sVar3 = (syntax->assignments).elements._M_extent._M_extent_value;
  __begin2.list = &syntax->assignments;
  do {
    if ((__begin2.list == &syntax->assignments) && (__begin2.index == sVar3 + 1 >> 1)) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
      ::~table_core((table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
                     *)&seenNames.super_Storage.field_0x88);
      return;
    }
    args = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::
           iterator_base<const_slang::syntax::ExpressionSyntax_*>::dereference(&__begin2);
    if ((netType->netKind != Unknown) && ((args->super_SyntaxNode).kind == AssignmentExpression)) {
      implicitNetNames.super_SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*>.data_ =
           (pointer)implicitNetNames.
                    super_SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*>.firstElement;
      implicitNetNames.super_SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*>.len = 0;
      implicitNetNames.super_SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*>.cap = 5;
      context_00 = &context;
      Expression::findPotentiallyImplicitNets
                (*(SyntaxNode **)&args[1].super_SyntaxNode,context_00,
                 &implicitNetNames.
                  super_SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*>);
      ppIVar1 = implicitNetNames.super_SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*>.
                data_ + implicitNetNames.
                        super_SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*>.len;
      for (ppIVar9 = implicitNetNames.
                     super_SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*>.data_;
          ppIVar9 != ppIVar1; ppIVar9 = ppIVar9 + 1) {
        syntax_00 = *ppIVar9;
        local_210 = (undefined1  [16])parsing::Token::valueText(&syntax_00->identifier);
        hash = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                         ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                          &seenNames.super_Storage.field_0x88,
                          (basic_string_view<char,_std::char_traits<char>_> *)local_210);
        pos0 = hash >> (seenNames._144_1_ & 0x3f);
        lVar10 = (hash & 0xff) * 4;
        cVar14 = (&UNK_003fea9c)[lVar10];
        cVar15 = (&UNK_003fea9d)[lVar10];
        cVar16 = (&UNK_003fea9e)[lVar10];
        bVar17 = (&UNK_003fea9f)[lVar10];
        uVar8 = 0;
        uVar11 = pos0;
        cVar18 = cVar14;
        cVar19 = cVar15;
        cVar20 = cVar16;
        bVar21 = bVar17;
        cVar22 = cVar14;
        cVar23 = cVar15;
        cVar24 = cVar16;
        bVar25 = bVar17;
        cVar26 = cVar14;
        cVar27 = cVar15;
        cVar28 = cVar16;
        bVar29 = bVar17;
        do {
          pcVar2 = (char *)(seenNames._160_8_ + uVar11 * 0x10);
          local_160.randomizeDetails._0_1_ = *pcVar2;
          local_160.randomizeDetails._1_1_ = pcVar2[1];
          local_160.randomizeDetails._2_1_ = pcVar2[2];
          local_160.randomizeDetails._3_1_ = pcVar2[3];
          local_160.randomizeDetails._4_1_ = pcVar2[4];
          local_160.randomizeDetails._5_1_ = pcVar2[5];
          local_160.randomizeDetails._6_1_ = pcVar2[6];
          local_160.randomizeDetails._7_1_ = pcVar2[7];
          local_160.assertionInstance._0_1_ = pcVar2[8];
          local_160.assertionInstance._1_1_ = pcVar2[9];
          local_160.assertionInstance._2_1_ = pcVar2[10];
          local_160.assertionInstance._3_1_ = pcVar2[0xb];
          local_160.assertionInstance._4_1_ = pcVar2[0xc];
          local_160.assertionInstance._5_1_ = pcVar2[0xd];
          local_160.assertionInstance._6_1_ = pcVar2[0xe];
          bVar6 = pcVar2[0xf];
          auVar13[0] = -((char)local_160.randomizeDetails == cVar14);
          auVar13[1] = -(local_160.randomizeDetails._1_1_ == cVar15);
          auVar13[2] = -(local_160.randomizeDetails._2_1_ == cVar16);
          auVar13[3] = -(local_160.randomizeDetails._3_1_ == bVar17);
          auVar13[4] = -(local_160.randomizeDetails._4_1_ == cVar18);
          auVar13[5] = -(local_160.randomizeDetails._5_1_ == cVar19);
          auVar13[6] = -(local_160.randomizeDetails._6_1_ == cVar20);
          auVar13[7] = -(local_160.randomizeDetails._7_1_ == bVar21);
          auVar13[8] = -((char)local_160.assertionInstance == cVar22);
          auVar13[9] = -(local_160.assertionInstance._1_1_ == cVar23);
          auVar13[10] = -(local_160.assertionInstance._2_1_ == cVar24);
          auVar13[0xb] = -(local_160.assertionInstance._3_1_ == bVar25);
          auVar13[0xc] = -(local_160.assertionInstance._4_1_ == cVar26);
          auVar13[0xd] = -(local_160.assertionInstance._5_1_ == cVar27);
          auVar13[0xe] = -(local_160.assertionInstance._6_1_ == cVar28);
          auVar13[0xf] = -(bVar6 == bVar29);
          uVar7 = (uint)(ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe);
          local_160.assertionInstance._7_1_ = bVar6;
          if (uVar7 != 0) {
            lVar12 = seenNames._160_8_ + uVar11 * 0x10;
            lVar10 = seenNames._168_8_ + uVar11 * 0xf0;
            local_160.instanceOrProc._0_1_ = cVar14;
            local_160.instanceOrProc._1_1_ = cVar15;
            local_160.instanceOrProc._2_1_ = cVar16;
            local_160.instanceOrProc._3_1_ = bVar17;
            local_160.instanceOrProc._4_1_ = cVar18;
            local_160.instanceOrProc._5_1_ = cVar19;
            local_160.instanceOrProc._6_1_ = cVar20;
            local_160.instanceOrProc._7_1_ = bVar21;
            local_160.firstTempVar._0_1_ = cVar22;
            local_160.firstTempVar._1_1_ = cVar23;
            local_160.firstTempVar._2_1_ = cVar24;
            local_160.firstTempVar._3_1_ = bVar25;
            local_160.firstTempVar._4_1_ = cVar26;
            local_160.firstTempVar._5_1_ = cVar27;
            local_160.firstTempVar._6_1_ = cVar28;
            local_160.firstTempVar._7_1_ = bVar29;
            do {
              iVar4 = 0;
              if (uVar7 != 0) {
                for (; (uVar7 >> iVar4 & 1) == 0; iVar4 = iVar4 + 1) {
                }
              }
              context_00 = (ASTContext *)local_210;
              bVar5 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                      operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *
                                 )&seenNames.super_Storage.field_0x88,
                                 (basic_string_view<char,_std::char_traits<char>_> *)context_00,
                                 (basic_string_view<char,_std::char_traits<char>_> *)
                                 ((ulong)(uint)(iVar4 << 4) + lVar10));
              if (bVar5) goto LAB_0037e9ec;
              uVar7 = uVar7 - 1 & uVar7;
            } while (uVar7 != 0);
            bVar6 = *(byte *)(lVar12 + 0xf);
            cVar14 = (char)local_160.instanceOrProc;
            cVar15 = local_160.instanceOrProc._1_1_;
            cVar16 = local_160.instanceOrProc._2_1_;
            bVar17 = local_160.instanceOrProc._3_1_;
            cVar18 = local_160.instanceOrProc._4_1_;
            cVar19 = local_160.instanceOrProc._5_1_;
            cVar20 = local_160.instanceOrProc._6_1_;
            bVar21 = local_160.instanceOrProc._7_1_;
            cVar22 = (char)local_160.firstTempVar;
            cVar23 = local_160.firstTempVar._1_1_;
            cVar24 = local_160.firstTempVar._2_1_;
            bVar25 = local_160.firstTempVar._3_1_;
            cVar26 = local_160.firstTempVar._4_1_;
            cVar27 = local_160.firstTempVar._5_1_;
            cVar28 = local_160.firstTempVar._6_1_;
            bVar29 = local_160.firstTempVar._7_1_;
          }
          if (((&boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::
                 is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & bVar6) == 0) break;
          lVar10 = uVar11 + uVar8;
          uVar8 = uVar8 + 1;
          uVar11 = lVar10 + 1U & seenNames._152_8_;
        } while (uVar8 <= (ulong)seenNames._152_8_);
        if ((ulong)seenNames._184_8_ < (ulong)seenNames._176_8_) {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,128ul,16ul>>
          ::unchecked_emplace_at<std::basic_string_view<char,std::char_traits<char>>>
                    ((locator *)&local_160,
                     (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,128ul,16ul>>
                      *)&seenNames.super_Storage.field_0x88,pos0,hash,
                     (basic_string_view<char,_std::char_traits<char>_> *)local_210);
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,128ul,16ul>>
          ::unchecked_emplace_with_rehash<std::basic_string_view<char,std::char_traits<char>>>
                    ((locator *)&local_160,
                     (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,128ul,16ul>>
                      *)&seenNames.super_Storage.field_0x88,hash,
                     (basic_string_view<char,_std::char_traits<char>_> *)local_210);
        }
        local_160.scope.ptr = (Scope *)NetSymbol::createImplicit(compilation,syntax_00,netType);
        context_00 = &local_160;
        SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*>
                  ((SmallVectorBase<slang::ast::Symbol_const*> *)implicitNets,(Symbol **)context_00)
        ;
LAB_0037e9ec:
      }
      SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*>::cleanup
                (&implicitNetNames.
                  super_SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*>,
                 (EVP_PKEY_CTX *)context_00);
    }
    this = BumpAllocator::
           emplace<slang::ast::ContinuousAssignSymbol,slang::syntax::ExpressionSyntax_const&>
                     (&compilation->super_BumpAllocator,args);
    syntax_01._M_ptr =
         (syntax->super_MemberSyntax).attributes.
         super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
    syntax_01._M_extent._M_extent_value =
         (syntax->super_MemberSyntax).attributes.
         super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
         _M_extent_value;
    Symbol::setAttributes(&this->super_Symbol,context.scope.ptr,syntax_01);
    implicitNetNames.super_SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*>.data_ =
         (pointer)this;
    SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*>
              ((SmallVectorBase<slang::ast::Symbol_const*> *)results,(Symbol **)&implicitNetNames);
    __begin2.index = __begin2.index + 1;
  } while( true );
}

Assistant:

void ContinuousAssignSymbol::fromSyntax(Compilation& compilation,
                                        const ContinuousAssignSyntax& syntax,
                                        const ASTContext& parentContext,
                                        SmallVectorBase<const Symbol*>& results,
                                        SmallVectorBase<const Symbol*>& implicitNets) {
    ASTContext context = parentContext.resetFlags(ASTFlags::NonProcedural);
    auto& netType = context.scope->getDefaultNetType();
    SmallSet<std::string_view, 8> seenNames;

    for (auto expr : syntax.assignments) {
        // If not explicitly disabled, check for net references on the lhs of each
        // assignment that should create implicit nets.
        if (!netType.isError()) {
            // The expression here should always be an assignment expression unless
            // the program is already ill-formed (diagnosed by the parser).
            if (expr->kind == SyntaxKind::AssignmentExpression) {
                SmallVector<const IdentifierNameSyntax*> implicitNetNames;
                Expression::findPotentiallyImplicitNets(*expr->as<BinaryExpressionSyntax>().left,
                                                        context, implicitNetNames);

                for (auto ins : implicitNetNames) {
                    if (seenNames.emplace(ins->identifier.valueText()).second) {
                        implicitNets.push_back(
                            &NetSymbol::createImplicit(compilation, *ins, netType));
                    }
                }
            }
        }

        auto symbol = compilation.emplace<ContinuousAssignSymbol>(*expr);
        symbol->setAttributes(*context.scope, syntax.attributes);
        results.push_back(symbol);
    }
}